

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_d3d56.cc
# Opt level: O3

void __thiscall
hwtest::pgraph::MthdEmuD3D0TexFilter::~MthdEmuD3D0TexFilter(MthdEmuD3D0TexFilter *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00356770;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		for (int i = 0; i < 2; i++) {
			insrt(exp.d3d56_tex_filter[i], 1, 4, extr(val, 1, 4));
			insrt(exp.d3d56_tex_filter[i], 9, 4, extr(val, 9, 4));
			insrt(exp.d3d56_tex_filter[i], 15, 1, 0);
			insrt(exp.d3d56_tex_filter[i], 16, 8, extrs(val, 17, 7));
			insrt(exp.d3d56_tex_filter[i], 27, 1, 1);
			insrt(exp.d3d56_tex_filter[i], 31, 1, 1);
		}
		insrt(exp.valid[1], 23, 1, 1);
		insrt(exp.valid[1], 16, 1, 1);
	}